

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O3

array_n<char,_3,_std::allocator<char>_> * __thiscall
sisl::array_n<char,_3,_std::allocator<char>_>::operator=
          (array_n<char,_3,_std::allocator<char>_> *this,
          array_n<char,_3,_std::allocator<char>_> *obj)

{
  pointer pcVar1;
  pointer pcVar2;
  char *pcVar3;
  uint uVar4;
  pointer __s;
  long lVar5;
  size_t __n;
  pointer unaff_R13;
  uint auStack_50 [2];
  undefined8 local_48;
  uint local_40;
  
  local_40 = obj->_dims[2];
  local_48 = *(undefined8 *)obj->_dims;
  uVar4 = obj->_dims[1] * obj->_dims[0] * obj->_dims[2];
  if (uVar4 == 0) {
    __n = 0;
    __s = (pointer)0x0;
  }
  else {
    __n = (size_t)uVar4;
    __s = (pointer)operator_new(__n);
    memset(__s,0,__n);
    unaff_R13 = __s + __n;
  }
  memcpy(__s,obj->_array,__n);
  lVar5 = 2;
  do {
    uVar4 = this->_dims[lVar5 + -2];
    this->_dims[lVar5 + -2] = auStack_50[lVar5];
    auStack_50[lVar5] = uVar4;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  pcVar1 = this->first;
  pcVar2 = this->last;
  this->first = __s;
  this->last = unaff_R13;
  pcVar3 = this->_array;
  this->_array = __s;
  if (((pcVar3 != (char *)0x0) && (pcVar1 != pcVar2)) &&
     (local_48._4_4_ * local_40 * (int)local_48 != 0)) {
    operator_delete(pcVar1);
  }
  return this;
}

Assistant:

array_n &operator=(const array_n &obj){
            array_n copy(obj);

            for(int i = 0; i < N; i++) {
                std::swap(_dims[i], copy._dims[i]);
            }
            std::swap(first, copy.first);
            std::swap(last, copy.last);
            std::swap(_array, copy._array);

            return *this;
        }